

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

void __thiscall
node::BlockManager::FindFilesToPrune
          (BlockManager *this,set<int,_std::less<int>,_std::allocator<int>_> *setFilesToPrune,
          int last_prune,Chainstate *chain,ChainstateManager *chainman)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  pointer pCVar6;
  string_view source_file;
  bool bVar7;
  int iVar8;
  int iVar9;
  uleb128 *puVar10;
  pair<int,_int> pVar11;
  uint64_t uVar12;
  Logger *pLVar13;
  int iVar14;
  int fileNumber;
  uleb128 *puVar15;
  uint uVar16;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  unsigned_long local_128;
  ulong local_120;
  ulong local_118;
  ChainstateRole local_110;
  int count;
  pair<int,_int> local_108 [2];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  string local_78;
  string log_msg;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
             ,0x134,false);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&this->cs_LastBlockFile,"cs_LastBlockFile",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
             ,0x134,false);
  uVar3 = (this->m_opts).prune_target;
  ChainstateManager::GetAll
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&log_msg,chainman);
  puVar10 = (uleb128 *)
            (uVar3 / (ulong)((long)(log_msg._M_string_length - (long)log_msg._M_dataplus._M_p) >> 3)
            );
  puVar15 = (uleb128 *)0x22600000;
  if ((uleb128 *)0x22600000 < puVar10) {
    puVar15 = puVar10;
  }
  std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
            ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&log_msg);
  iVar8 = (int)((ulong)((long)(chain->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(chain->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((0 < iVar8) && (((chainman->m_options).chainparams)->nPruneAfterHeight < (ulong)(iVar8 - 1)))
  {
    uVar1 = chainman->m_best_header->nHeight;
    pVar11 = ChainstateManager::GetPruneRange(chainman,chain,last_prune);
    local_108[0] = pVar11;
    uVar12 = CalculateCurrentUsage(this);
    count = 0;
    if (puVar15 <= &uleb128_01100000 + uVar12) {
      ppCVar4 = (chain->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppCVar5 = (chain->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar7 = ChainstateManager::IsInitialBlockDownload(chainman);
      uVar16 = (int)((ulong)((long)ppCVar4 - (long)ppCVar5) >> 3) - 1;
      puVar10 = &uleb128_01100000;
      if (bVar7 && uVar16 < uVar1) {
        puVar10 = &uleb128_01100000 + ((long)(int)uVar1 - (long)(int)uVar16) * 1000000;
      }
      iVar8 = 0;
      fileNumber = 0;
      do {
        log_msg._M_dataplus._M_p._0_4_ = fileNumber;
        iVar9 = 0;
        if ((this->m_blockfile_cursors)._M_elems[0].
            super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
            super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
          iVar9 = (this->m_blockfile_cursors)._M_elems[0].
                  super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                  super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
        }
        iVar14 = 0;
        if ((this->m_blockfile_cursors)._M_elems[1].
            super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
            super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
          iVar14 = (this->m_blockfile_cursors)._M_elems[1].
                   super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                   super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
        }
        if (iVar14 < iVar9) {
          iVar14 = iVar9;
        }
        if (iVar14 <= fileNumber) break;
        pCVar6 = (this->m_blockfile_info).
                 super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar1 = pCVar6[fileNumber].nSize;
        if (uVar1 != 0) {
          if (puVar10 + uVar12 < puVar15) break;
          if ((pCVar6[fileNumber].nHeightLast <= (uint)pVar11.second) &&
             ((uint)pVar11.first <= pCVar6[fileNumber].nHeightFirst)) {
            uVar16 = pCVar6[fileNumber].nUndoSize;
            PruneOneBlockFile(this,fileNumber);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       setFilesToPrune,(int *)&log_msg);
            uVar12 = uVar12 - (uVar1 + uVar16);
            count = iVar8 + 1;
            fileNumber = (int)log_msg._M_dataplus._M_p;
            iVar8 = count;
          }
        }
        fileNumber = fileNumber + 1;
      } while( true );
    }
    bVar7 = ::LogAcceptCategory(PRUNE,Debug);
    if (bVar7) {
      local_110 = Chainstate::GetRole(chain);
      local_118 = (ulong)puVar15 >> 0x14;
      local_120 = uVar12 >> 0x14;
      local_128 = (long)((long)puVar15 - uVar12) / 0x100000;
      pLVar13 = LogInstance();
      bVar7 = BCLog::Logger::Enabled(pLVar13);
      if (bVar7) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<ChainstateRole,unsigned_long,unsigned_long,long,int,int,int>
                  (&local_78,
                   (tinyformat *)
                   "[%s] target=%dMiB actual=%dMiB diff=%dMiB min_height=%d max_prune_height=%d removed %d blk/rev pairs\n"
                   ,(char *)&local_110,(ChainstateRole *)&local_118,&local_120,&local_128,
                   (long *)local_108,&local_108[0].second,&count,
                   (int *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        pLVar13 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x5e;
        local_78._M_string_length = 0xcb2cf4;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file._M_len = 0x5e;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "FindFilesToPrune";
        logging_function._M_len = 0x10;
        BCLog::Logger::LogPrintStr(pLVar13,str,logging_function,source_file,0x175,PRUNE,Debug);
        std::__cxx11::string::~string((string *)&log_msg);
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BlockManager::FindFilesToPrune(
    std::set<int>& setFilesToPrune,
    int last_prune,
    const Chainstate& chain,
    ChainstateManager& chainman)
{
    LOCK2(cs_main, cs_LastBlockFile);
    // Distribute our -prune budget over all chainstates.
    const auto target = std::max(
        MIN_DISK_SPACE_FOR_BLOCK_FILES, GetPruneTarget() / chainman.GetAll().size());
    const uint64_t target_sync_height = chainman.m_best_header->nHeight;

    if (chain.m_chain.Height() < 0 || target == 0) {
        return;
    }
    if (static_cast<uint64_t>(chain.m_chain.Height()) <= chainman.GetParams().PruneAfterHeight()) {
        return;
    }

    const auto [min_block_to_prune, last_block_can_prune] = chainman.GetPruneRange(chain, last_prune);

    uint64_t nCurrentUsage = CalculateCurrentUsage();
    // We don't check to prune until after we've allocated new space for files
    // So we should leave a buffer under our target to account for another allocation
    // before the next pruning.
    uint64_t nBuffer = BLOCKFILE_CHUNK_SIZE + UNDOFILE_CHUNK_SIZE;
    uint64_t nBytesToPrune;
    int count = 0;

    if (nCurrentUsage + nBuffer >= target) {
        // On a prune event, the chainstate DB is flushed.
        // To avoid excessive prune events negating the benefit of high dbcache
        // values, we should not prune too rapidly.
        // So when pruning in IBD, increase the buffer to avoid a re-prune too soon.
        const auto chain_tip_height = chain.m_chain.Height();
        if (chainman.IsInitialBlockDownload() && target_sync_height > (uint64_t)chain_tip_height) {
            // Since this is only relevant during IBD, we assume blocks are at least 1 MB on average
            static constexpr uint64_t average_block_size = 1000000;  /* 1 MB */
            const uint64_t remaining_blocks = target_sync_height - chain_tip_height;
            nBuffer += average_block_size * remaining_blocks;
        }

        for (int fileNumber = 0; fileNumber < this->MaxBlockfileNum(); fileNumber++) {
            const auto& fileinfo = m_blockfile_info[fileNumber];
            nBytesToPrune = fileinfo.nSize + fileinfo.nUndoSize;

            if (fileinfo.nSize == 0) {
                continue;
            }

            if (nCurrentUsage + nBuffer < target) { // are we below our target?
                break;
            }

            // don't prune files that could have a block that's not within the allowable
            // prune range for the chain being pruned.
            if (fileinfo.nHeightLast > (unsigned)last_block_can_prune || fileinfo.nHeightFirst < (unsigned)min_block_to_prune) {
                continue;
            }

            PruneOneBlockFile(fileNumber);
            // Queue up the files for removal
            setFilesToPrune.insert(fileNumber);
            nCurrentUsage -= nBytesToPrune;
            count++;
        }
    }

    LogDebug(BCLog::PRUNE, "[%s] target=%dMiB actual=%dMiB diff=%dMiB min_height=%d max_prune_height=%d removed %d blk/rev pairs\n",
             chain.GetRole(), target / 1024 / 1024, nCurrentUsage / 1024 / 1024,
             (int64_t(target) - int64_t(nCurrentUsage)) / 1024 / 1024,
             min_block_to_prune, last_block_can_prune, count);
}